

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::IGXMLScanner::resizeElemState(IGXMLScanner *this)

{
  MemoryManager *pMVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  uint *puVar7;
  ulong uVar8;
  uint *puVar6;
  undefined4 extraout_var_00;
  
  uVar4 = this->fElemStateSize * 2;
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar5 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar4 * 4);
  puVar6 = (uint *)CONCAT44(extraout_var,iVar5);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  iVar5 = (*pMVar1->_vptr_MemoryManager[3])(pMVar1,(ulong)uVar4 * 4);
  puVar7 = (uint *)CONCAT44(extraout_var_00,iVar5);
  if (this->fElemStateSize == 0) {
    uVar8 = 0;
  }
  else {
    puVar2 = this->fElemState;
    puVar3 = this->fElemLoopState;
    uVar8 = 0;
    do {
      puVar6[uVar8] = puVar2[uVar8];
      puVar7[uVar8] = puVar3[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->fElemStateSize);
  }
  if ((uint)uVar8 < uVar4) {
    uVar8 = uVar8 & 0xffffffff;
    do {
      puVar6[uVar8] = 0;
      puVar7[uVar8] = 0;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fElemState);
  pMVar1 = (this->super_XMLScanner).fMemoryManager;
  (*pMVar1->_vptr_MemoryManager[4])(pMVar1,this->fElemLoopState);
  this->fElemState = puVar6;
  this->fElemLoopState = puVar7;
  this->fElemStateSize = uVar4;
  return;
}

Assistant:

void IGXMLScanner::resizeElemState() {

    unsigned int newSize = fElemStateSize * 2;
    unsigned int* newElemState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];
    unsigned int* newElemLoopState = (unsigned int*) fMemoryManager->allocate
    (
        newSize * sizeof(unsigned int)
    ); //new unsigned int[newSize];

    // Copy the existing values
    unsigned int index = 0;
    for (; index < fElemStateSize; index++)
    {
        newElemState[index] = fElemState[index];
        newElemLoopState[index] = fElemLoopState[index];
    }

    for (; index < newSize; index++)
        newElemLoopState[index] = newElemState[index] = 0;

    // Delete the old array and udpate our members
    fMemoryManager->deallocate(fElemState); //delete [] fElemState;
    fMemoryManager->deallocate(fElemLoopState); //delete [] fElemState;
    fElemState = newElemState;
    fElemLoopState = newElemLoopState;
    fElemStateSize = newSize;
}